

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O1

int decodeInstruction(InternalInstruction *insn,byteReader_t reader,void *readerArg,
                     uint64_t startLoc,DisassemblerMode mode)

{
  DisassemblerMode DVar1;
  VectorExtensionType VVar2;
  short sVar3;
  bool bVar4;
  byte bVar5;
  uint8_t uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint64_t uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 uVar13;
  uint64_t uVar11;
  ulong uVar12;
  uint8_t uVar14;
  ushort uVar15;
  short sVar17;
  uint uVar18;
  ulong uVar19;
  ushort uVar20;
  byte bVar21;
  uint8_t uVar22;
  reader_info *prVar23;
  uint8_t *puVar24;
  bool bVar25;
  uint8_t byte;
  uint8_t nextByte;
  uint16_t instructionID;
  uint8_t byte1_3;
  uint8_t byte1;
  uint8_t byte1_1;
  uint8_t byte1_2;
  uint8_t byte2;
  uint16_t instructionIDWithOpsize;
  byte local_4b;
  byte local_4a;
  byte local_49;
  ushort local_48;
  byte local_46;
  byte local_45;
  byte local_44;
  byte local_43;
  byte local_42;
  byte local_41;
  ulong local_40;
  undefined4 local_38;
  ushort local_34;
  ushort local_32;
  ushort uVar16;
  
  insn->reader = reader;
  insn->readerArg = readerArg;
  insn->startLocation = startLoc;
  insn->readerCursor = startLoc;
  insn->mode = mode;
  local_4b = 0;
  bVar25 = true;
  local_40 = 0;
  local_38 = 0;
  do {
    if (insn->mode == MODE_64BIT) {
      iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_4b,insn->readerCursor);
      if (iVar7 != 0) {
        return -1;
      }
      uVar10 = insn->readerCursor;
      uVar11 = uVar10 + 1;
      insn->readerCursor = uVar11;
      if ((local_4b & 0xf0) == 0x40) {
        prVar23 = (reader_info *)insn->readerArg;
        while( true ) {
          iVar7 = (*insn->reader)(prVar23,&local_4b,uVar11);
          if (iVar7 != 0) {
            return -1;
          }
          if ((local_4b & 0xf0) != 0x40) break;
          iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_4b,insn->readerCursor);
          if (iVar7 == 0) {
            insn->readerCursor = insn->readerCursor + 1;
          }
          prVar23 = (reader_info *)insn->readerArg;
          uVar11 = insn->readerCursor;
        }
        if ((((local_4b - 0x2e < 0x3a) &&
             ((0x3c0000000010101U >> ((ulong)(local_4b - 0x2e) & 0x3f) & 1) != 0)) ||
            ((local_4b - 0xf0 < 4 && (local_4b - 0xf0 != 1)))) || (local_4b == 0x26))
        goto LAB_001a6653;
        uVar10 = insn->readerCursor - 1;
      }
      insn->readerCursor = uVar10;
    }
LAB_001a6653:
    uVar11 = insn->readerCursor;
    iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_4b,uVar11);
    if (iVar7 != 0) break;
    uVar12 = insn->readerCursor;
    uVar10 = uVar12 + 1;
    insn->readerCursor = uVar10;
    if ((uVar12 == insn->startLocation) &&
       (uVar12 = CONCAT71((int7)(uVar12 >> 8),local_4b) & 0xfffffffffffffffe, (char)uVar12 == -0xe))
    {
      iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_49,uVar10);
      uVar12 = CONCAT44(extraout_var,iVar7);
      if (iVar7 == 0) {
        uVar12 = CONCAT71((int7)(uVar12 >> 8),local_4b);
        if (((local_4b & 0xfe) == 0xf2) &&
           (((local_49 == 0xf0 || ((local_49 & 0xfe) == 0x86)) || ((local_49 & 0xf8) == 0x90)))) {
          insn->xAcquireRelease = true;
        }
        if (((local_4b == 0xf3) && (uVar12 = (ulong)(local_49 - 0x88), local_49 - 0x88 < 0x40)) &&
           ((0xc000000000000003U >> (uVar12 & 0x3f) & 1) != 0)) {
          insn->xAcquireRelease = true;
        }
        if ((insn->mode == MODE_64BIT) &&
           (uVar12 = CONCAT71((int7)(uVar12 >> 8),local_49) & 0xfffffffffffffff0,
           (char)uVar12 == '@')) {
          iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_49,insn->readerCursor);
          if (iVar7 != 0) {
            return -1;
          }
          uVar10 = insn->readerCursor + 1;
          insn->readerCursor = uVar10;
          iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_49,uVar10);
          uVar12 = CONCAT44(extraout_var_00,iVar7);
          if (iVar7 != 0) {
            return -1;
          }
          insn->readerCursor = insn->readerCursor - 1;
        }
      }
    }
    uVar13 = (undefined7)(uVar12 >> 8);
    uVar12 = (ulong)local_4b;
    if (local_4b < 0x3e) {
      if (local_4b == 0x26) {
        insn->segmentOverride = SEG_OVERRIDE_ES;
      }
      else if (local_4b == 0x2e) {
        insn->segmentOverride = SEG_OVERRIDE_CS;
      }
      else {
        if (local_4b != 0x36) goto LAB_001a682e;
        insn->segmentOverride = SEG_OVERRIDE_SS;
      }
      goto LAB_001a6874;
    }
    switch(local_4b) {
    case 100:
      insn->segmentOverride = SEG_OVERRIDE_FS;
      goto LAB_001a6874;
    case 0x65:
      insn->segmentOverride = SEG_OVERRIDE_GS;
LAB_001a6874:
      insn->prefixPresent[0x2e] = '\0';
      insn->prefixPresent[0x36] = '\0';
      insn->prefixPresent[0x3e] = '\0';
      insn->prefixPresent[0x26] = '\0';
      insn->prefixPresent[100] = '\0';
      insn->prefixPresent[0x65] = '\0';
      insn->prefixPresent[uVar12] = '\x01';
      insn->prefixLocations[uVar12] = uVar11;
      insn->prefix1 = local_4b;
      break;
    case 0x66:
      insn->prefixPresent[uVar12] = '\x01';
      insn->prefixLocations[uVar12] = uVar11;
      insn->prefix2 = local_4b;
      local_40 = CONCAT71(uVar13,1);
      break;
    case 0x67:
      insn->prefixPresent[uVar12] = '\x01';
      insn->prefixLocations[uVar12] = uVar11;
      insn->prefix3 = local_4b;
      local_38 = (undefined4)CONCAT71(uVar13,1);
      break;
    default:
      if ((local_4b - 0xf0 < 4) && (local_4b - 0xf0 != 1)) {
        insn->prefixPresent[0xf2] = '\0';
        insn->prefixPresent[0xf3] = '\0';
        insn->prefixPresent[0xf0] = '\0';
        insn->prefixPresent[uVar12] = '\x01';
        insn->prefixLocations[uVar12] = uVar11;
        insn->prefix0 = local_4b;
      }
      else {
        if (local_4b == 0x3e) {
          insn->segmentOverride = SEG_OVERRIDE_DS;
          goto LAB_001a6874;
        }
LAB_001a682e:
        bVar25 = false;
      }
    }
  } while (bVar25);
  insn->vectorExtensionType = TYPE_NO_VEX_XOP;
  if (local_4b < 0xc4) {
    if (local_4b == 0x62) {
      iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_45,insn->readerCursor);
      if (iVar7 != 0) {
        return -1;
      }
      uVar10 = insn->readerCursor;
      uVar11 = uVar10 + 1;
      insn->readerCursor = uVar11;
      if ((local_45 & 0xc) == 0 && (0xbf < local_45 || insn->mode == MODE_64BIT)) {
        iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_41,uVar11);
        if (iVar7 != 0) {
          return -1;
        }
        if ((local_41 & 4) == 0) {
          uVar11 = insn->readerCursor;
          insn->readerCursor = uVar11 - 2;
          insn->necessaryPrefixLocation = uVar11 - 4;
        }
        else {
          insn->vectorExtensionType = TYPE_EVEX;
        }
        if (insn->vectorExtensionType == TYPE_EVEX) {
          insn->vectorExtensionPrefix[0] = local_4b;
          insn->vectorExtensionPrefix[1] = local_45;
          iVar7 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 2,
                                  insn->readerCursor);
          if (iVar7 != 0) {
            return -1;
          }
          uVar11 = insn->readerCursor + 1;
          insn->readerCursor = uVar11;
          iVar7 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 3,
                                  uVar11);
          if (iVar7 != 0) {
            return -1;
          }
LAB_001a6c08:
          insn->readerCursor = insn->readerCursor + 1;
          goto LAB_001a6c0f;
        }
      }
      else {
        insn->readerCursor = uVar10 - 1;
      }
    }
    else {
      if (local_4b != 0x8f) goto LAB_001a6979;
      iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_44,insn->readerCursor);
      uVar12 = local_40;
      if (iVar7 == 0) {
        if ((local_44 & 0x38) == 0) {
          uVar11 = insn->readerCursor;
          insn->readerCursor = uVar11 - 1;
          uVar11 = uVar11 - 2;
        }
        else {
          insn->vectorExtensionType = TYPE_XOP;
          uVar11 = insn->readerCursor - 1;
        }
        insn->necessaryPrefixLocation = uVar11;
        if (insn->vectorExtensionType == TYPE_XOP) {
          insn->vectorExtensionPrefix[0] = local_4b;
          iVar8 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 1,
                                  insn->readerCursor);
          if (iVar8 == 0) {
            insn->readerCursor = insn->readerCursor + 1;
          }
          puVar24 = insn->vectorExtensionPrefix + 2;
          iVar8 = (*insn->reader)((reader_info *)insn->readerArg,puVar24,insn->readerCursor);
          if (iVar8 == 0) {
            insn->readerCursor = insn->readerCursor + 1;
          }
          if (insn->mode == MODE_64BIT) {
            bVar5 = (byte)~insn->vectorExtensionPrefix[1] >> 5 |
                    insn->vectorExtensionPrefix[2] >> 4 & 8;
LAB_001a6cf6:
            insn->rexPrefix = bVar5 | 0x40;
          }
LAB_001a6cfe:
          uVar12 = 1;
          if ((*puVar24 & 3) != 1) {
            uVar12 = local_40 & 0xff;
          }
        }
      }
LAB_001a6d17:
      local_40 = uVar12;
      if (iVar7 != 0) {
        return -1;
      }
    }
  }
  else if (local_4b == 0xc4) {
    iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_42,insn->readerCursor);
    if (iVar7 != 0) {
      return -1;
    }
    if ((insn->mode == MODE_64BIT) || (0xbf < local_42)) {
      insn->vectorExtensionType = TYPE_VEX_3B;
      uVar11 = insn->readerCursor - 1;
    }
    else {
      uVar11 = insn->readerCursor;
      insn->readerCursor = uVar11 - 1;
      uVar11 = uVar11 - 2;
    }
    insn->necessaryPrefixLocation = uVar11;
    if (insn->vectorExtensionType == TYPE_VEX_3B) {
      insn->vectorExtensionPrefix[0] = local_4b;
      iVar7 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 1,
                              insn->readerCursor);
      if (iVar7 == 0) {
        insn->readerCursor = insn->readerCursor + 1;
      }
      iVar7 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 2,
                              insn->readerCursor);
      if (iVar7 == 0) goto LAB_001a6c08;
LAB_001a6c0f:
      if (insn->mode == MODE_64BIT) {
        insn->rexPrefix =
             (byte)~insn->vectorExtensionPrefix[1] >> 5 | insn->vectorExtensionPrefix[2] >> 4 & 8 |
             0x40;
      }
    }
  }
  else {
    if (local_4b == 0xc5) {
      iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_43,insn->readerCursor);
      uVar12 = local_40;
      if (iVar7 == 0) {
        if ((insn->mode == MODE_64BIT) || (0xbf < local_43)) {
          insn->vectorExtensionType = TYPE_VEX_2B;
        }
        else {
          insn->readerCursor = insn->readerCursor - 1;
        }
        if (insn->vectorExtensionType == TYPE_VEX_2B) {
          insn->vectorExtensionPrefix[0] = local_4b;
          puVar24 = insn->vectorExtensionPrefix + 1;
          iVar8 = (*insn->reader)((reader_info *)insn->readerArg,puVar24,insn->readerCursor);
          if (iVar8 == 0) {
            insn->readerCursor = insn->readerCursor + 1;
          }
          if (insn->mode == MODE_64BIT) {
            bVar5 = (byte)~insn->vectorExtensionPrefix[1] >> 5 & 4;
            goto LAB_001a6cf6;
          }
          goto LAB_001a6cfe;
        }
      }
      goto LAB_001a6d17;
    }
LAB_001a6979:
    if ((insn->mode == MODE_64BIT) && ((local_4b & 0xf0) == 0x40)) {
      iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_46,insn->readerCursor);
      if (iVar7 != 0) {
        return -1;
      }
      while ((local_46 & 0xf0) == 0x40) {
        iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_4b,insn->readerCursor);
        if (iVar7 == 0) {
          insn->readerCursor = insn->readerCursor + 1;
        }
        iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_46,insn->readerCursor);
        if (iVar7 != 0) {
          return -1;
        }
      }
      insn->rexPrefix = local_4b;
      uVar11 = insn->readerCursor;
    }
    else {
      uVar11 = insn->readerCursor;
      insn->readerCursor = uVar11 - 1;
    }
    insn->necessaryPrefixLocation = uVar11 - 2;
  }
  DVar1 = insn->mode;
  bVar21 = (byte)local_38;
  bVar5 = (byte)local_40;
  if (DVar1 == MODE_64BIT) {
    if ((insn->rexPrefix & 8) != 0) {
      insn->registerSize = '\b';
      uVar22 = (~bVar21 & 1) * '\x04' + '\x04';
      uVar6 = '\x04';
      uVar14 = '\x04';
      goto LAB_001a6d71;
    }
    uVar14 = (~bVar5 & 1) * '\x02' + '\x02';
    insn->registerSize = uVar14;
    insn->addressSize = (~bVar21 & 1) * '\x04' + '\x04';
    insn->displacementSize = uVar14;
    insn->immediateSize = uVar14;
    if (insn->rexPrefix == 0) {
      uVar14 = (~bVar5 & 1) * '\x04' + '\x04';
    }
LAB_001a6d84:
    insn->immSize = uVar14;
  }
  else {
    if (DVar1 == MODE_32BIT) {
      uVar14 = (~bVar5 & 1) * '\x02' + '\x02';
      insn->registerSize = uVar14;
      bVar21 = ~bVar21;
LAB_001a6d64:
      uVar22 = (bVar21 & 1) * '\x02' + '\x02';
      uVar6 = uVar22;
LAB_001a6d71:
      insn->addressSize = uVar22;
      insn->displacementSize = uVar6;
      insn->immediateSize = uVar14;
      goto LAB_001a6d84;
    }
    if (DVar1 == MODE_16BIT) {
      uVar14 = (bVar5 & 1) * '\x02' + '\x02';
      insn->registerSize = uVar14;
      goto LAB_001a6d64;
    }
  }
  insn->opcodeType = ONEBYTE;
  switch(insn->vectorExtensionType) {
  case TYPE_VEX_2B:
switchD_001a6db3_caseD_1:
    insn->twoByteEscape = '\x0f';
switchD_001a6e43_caseD_1:
    insn->opcodeType = TWOBYTE;
    break;
  case TYPE_VEX_3B:
    bVar5 = insn->vectorExtensionPrefix[1] & 0x1f;
    if (bVar5 != 3) {
      if (bVar5 == 2) {
        insn->twoByteEscape = '\x0f';
        insn->threeByteEscape = '8';
        goto switchD_001a6e43_caseD_2;
      }
      if (bVar5 != 1) {
        return -1;
      }
      goto switchD_001a6db3_caseD_1;
    }
    insn->twoByteEscape = '\x0f';
    insn->threeByteEscape = ':';
switchD_001a6e43_caseD_3:
    insn->opcodeType = THREEBYTE_3A;
    break;
  case TYPE_EVEX:
    switch(insn->vectorExtensionPrefix[1] & 3) {
    case 0:
      return -1;
    case 1:
      goto switchD_001a6e43_caseD_1;
    case 2:
switchD_001a6e43_caseD_2:
      insn->opcodeType = THREEBYTE_38;
      break;
    case 3:
      goto switchD_001a6e43_caseD_3;
    }
    break;
  case TYPE_XOP:
    bVar5 = insn->vectorExtensionPrefix[1] & 0x1f;
    if (bVar5 == 10) {
      insn->opcodeType = XOPA_MAP;
    }
    else if (bVar5 == 9) {
      insn->opcodeType = XOP9_MAP;
    }
    else {
      if (bVar5 != 8) {
        return -1;
      }
      insn->opcodeType = XOP8_MAP;
    }
    break;
  default:
    iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_4a,insn->readerCursor);
    if (iVar7 != 0) {
      return -1;
    }
    uVar11 = insn->readerCursor + 1;
    insn->readerCursor = uVar11;
    insn->firstByte = local_4a;
    if (local_4a == 0xf) {
      insn->twoByteEscape = '\x0f';
      iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_4a,uVar11);
      if (iVar7 != 0) {
        return -1;
      }
      uVar11 = insn->readerCursor + 1;
      insn->readerCursor = uVar11;
      if (local_4a < 0x38) {
        if (local_4a == 0xe) {
          insn->opcodeType = T3DNOW_MAP;
          insn->consumedModRM = true;
        }
        else {
          if (local_4a != 0xf) goto LAB_001a75c5;
          iVar7 = readModRM(insn);
          if (iVar7 != 0) {
            return -1;
          }
          iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_4a,insn->readerCursor);
          if (iVar7 != 0) {
            return -1;
          }
          insn->readerCursor = insn->readerCursor + 1;
          insn->opcodeType = T3DNOW_MAP;
        }
      }
      else if (local_4a == 0x3a) {
        insn->threeByteEscape = ':';
        iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_4a,uVar11);
        if (iVar7 != 0) {
          return -1;
        }
        insn->readerCursor = insn->readerCursor + 1;
        insn->opcodeType = THREEBYTE_3A;
      }
      else if (local_4a == 0x38) {
        insn->threeByteEscape = '8';
        iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_4a,uVar11);
        if (iVar7 != 0) {
          return -1;
        }
        insn->readerCursor = insn->readerCursor + 1;
        insn->opcodeType = THREEBYTE_38;
      }
      else {
LAB_001a75c5:
        insn->opcodeType = TWOBYTE;
      }
    }
    insn->opcode = local_4a;
    goto LAB_001a700a;
  }
  iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&insn->opcode,insn->readerCursor);
  if (iVar7 != 0) {
    return -1;
  }
  insn->readerCursor = insn->readerCursor + 1;
LAB_001a700a:
  VVar2 = insn->vectorExtensionType;
  bVar25 = insn->mode == MODE_64BIT;
  if (VVar2 == TYPE_NO_VEX_XOP) {
    if (((insn->mode == MODE_16BIT) || (insn->prefixPresent[0x66] != '\x01')) ||
       (insn->prefixLocations[0x66] != insn->necessaryPrefixLocation)) {
      uVar11 = insn->necessaryPrefixLocation;
      if ((insn->prefixPresent[0x67] == '\x01') && (insn->prefixLocations[0x67] == uVar11)) {
        uVar20 = bVar25 | 0x20;
      }
      else if ((insn->prefixPresent[0xf3] == '\x01') && (insn->prefixLocations[0xf3] == uVar11)) {
        uVar20 = bVar25 | 2;
      }
      else {
        if ((insn->prefixPresent[0xf2] != '\x01') ||
           (bVar4 = true, insn->prefixLocations[0xf2] != uVar11)) {
          bVar4 = false;
        }
        uVar20 = (ushort)bVar25;
        if (bVar4) {
          uVar20 = bVar25 | 4;
        }
      }
    }
    else {
      uVar20 = bVar25 | 0x10;
    }
  }
  else {
    uVar20 = 0x40;
    if (VVar2 == TYPE_EVEX) {
      uVar20 = 0x100;
    }
    uVar20 = bVar25 | uVar20;
    if (VVar2 == TYPE_EVEX) {
      switch(insn->vectorExtensionPrefix[2] & 3) {
      case 1:
        uVar20 = uVar20 | 0x10;
        break;
      case 2:
        uVar20 = uVar20 | 2;
        break;
      case 3:
        uVar20 = uVar20 | 4;
      }
      bVar5 = insn->vectorExtensionPrefix[3];
      if ((char)bVar5 < '\0') {
        uVar20 = uVar20 + 0x1000;
      }
      sVar17 = (bVar5 & 0x10) * 0x200;
      sVar3 = sVar17 + 0x800;
      if ((bVar5 & 7) == 0) {
        sVar3 = sVar17;
      }
      uVar20 = (bVar5 & 0x60) << 4 | sVar3 + uVar20;
    }
    else {
      if (VVar2 == TYPE_VEX_2B) {
        bVar5 = insn->vectorExtensionPrefix[1];
        uVar16 = (ushort)bVar5;
        uVar15 = (ushort)bVar5;
        switch(bVar5 & 3) {
        case 1:
          goto switchD_001a70d9_caseD_1;
        case 2:
          goto switchD_001a70d9_caseD_2;
        case 3:
          goto switchD_001a70d9_caseD_3;
        }
      }
      else if (VVar2 == TYPE_XOP) {
        bVar5 = insn->vectorExtensionPrefix[2];
        uVar16 = (ushort)bVar5;
        uVar15 = (ushort)bVar5;
        switch(bVar5 & 3) {
        case 1:
          goto switchD_001a70d9_caseD_1;
        case 2:
          goto switchD_001a70d9_caseD_2;
        case 3:
          goto switchD_001a70d9_caseD_3;
        }
      }
      else {
        if (VVar2 != TYPE_VEX_3B) {
          return -1;
        }
        bVar5 = insn->vectorExtensionPrefix[2];
        uVar16 = (ushort)bVar5;
        uVar15 = (ushort)bVar5;
        switch(bVar5 & 3) {
        case 1:
switchD_001a70d9_caseD_1:
          uVar15 = uVar16;
          uVar20 = uVar20 | 0x10;
          break;
        case 2:
switchD_001a70d9_caseD_2:
          uVar15 = uVar16;
          uVar20 = uVar20 | 2;
          break;
        case 3:
switchD_001a70d9_caseD_3:
          uVar15 = uVar16;
          uVar20 = uVar20 | 4;
        }
      }
      uVar20 = uVar20 | (uVar15 & 4) << 5;
    }
  }
  uVar20 = uVar20 | insn->rexPrefix & 8;
  iVar7 = getIDWithAttrMask(&local_48,insn,uVar20);
  if (iVar7 != 0) {
    return -1;
  }
  if (((insn->mode == MODE_16BIT) && (insn->opcode == 0xe3)) &&
     (x86DisassemblerInstrSpecifiers[local_48].operands == 0x9c)) {
    uVar20 = uVar20 ^ 0x20;
    iVar7 = getIDWithAttrMask(&local_48,insn,uVar20);
    if (iVar7 != 0) {
      return -1;
    }
  }
  if (insn->mode == MODE_16BIT) {
    if ((uVar20 & 0x10) == 0) goto LAB_001a725f;
LAB_001a729f:
    if (((insn->opcodeType != ONEBYTE) || (insn->opcode != 0x90)) || ((insn->rexPrefix & 1) == 0)) {
      insn->instructionID = local_48;
      uVar19 = (ulong)local_48;
      goto LAB_001a72d5;
    }
    insn->opcode = 0x91;
    iVar7 = getIDWithAttrMask(&local_34,insn,uVar20);
    if (iVar7 == 0) {
      local_48 = local_34;
    }
    insn->opcode = 0x90;
    insn->instructionID = local_48;
    insn->spec = x86DisassemblerInstrSpecifiers + local_48;
  }
  else {
    if (((uVar20 & 0x10) != 0) || (insn->prefixPresent[0x66] == '\0')) goto LAB_001a729f;
LAB_001a725f:
    iVar7 = getIDWithAttrMask(&local_32,insn,uVar20 | 0x10);
    if ((iVar7 == 0) &&
       ((x86_16_bit_eq_lookup[local_48] != 0 &&
        (uVar9 = x86_16_bit_eq_lookup[local_48] - 1, uVar12 = (ulong)uVar9, uVar9 < 0x381)))) {
      uVar19 = (ulong)local_32;
      do {
        if (x86_16_bit_eq_tbl[uVar12].first != local_48) break;
        if (x86_16_bit_eq_tbl[uVar12].second == local_32) {
          if ((bool)insn->prefixPresent[0x66] != (insn->mode == MODE_16BIT)) {
            insn->instructionID = local_32;
            goto LAB_001a72d5;
          }
          break;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != 0x381);
    }
    insn->instructionID = local_48;
    uVar19 = (ulong)local_48;
LAB_001a72d5:
    insn->spec = x86DisassemblerInstrSpecifiers + uVar19;
  }
  uVar20 = insn->instructionID;
  iVar7 = -1;
  if (uVar20 == 0) {
    return -1;
  }
  if (insn->prefixPresent[0xf0] == '\0') goto LAB_001a7632;
  uVar9 = (uint)uVar20;
  if (uVar20 < 0x380) {
    if (uVar20 < 0x133) {
      if (((uVar20 - 0x21 < 0x35) &&
          ((0x1c01c0181c0e07U >> ((ulong)(uVar20 - 0x21) & 0x3f) & 1) != 0)) ||
         ((uVar20 - 0xac < 0x1d && ((0x181c0e07U >> (uVar20 - 0xac & 0x1f) & 1) != 0))))
      goto LAB_001a7632;
      uVar9 = uVar9 - 0x5f;
      if (0xd < uVar9) {
        return -1;
      }
      uVar18 = 0x3007;
    }
    else {
      if (((uVar20 - 0x133 < 0x22) && ((0x333333333U >> ((ulong)(uVar20 - 0x133) & 0x3f) & 1) != 0))
         || ((uVar20 - 0x28e < 0xd && ((0x1551U >> (uVar20 - 0x28e & 0x1f) & 1) != 0))))
      goto LAB_001a7632;
      uVar9 = uVar9 - 0x23b;
      if (7 < uVar9) {
        return -1;
      }
      uVar18 = 0xd5;
    }
  }
  else if (uVar9 == 0x9cf || uVar20 < 0x9cf) {
    if (((uVar20 - 0x70e < 0x3e) &&
        ((0x3c0e550000000055U >> ((ulong)(uVar20 - 0x70e) & 0x3f) & 1) != 0)) ||
       ((uVar20 - 0x380 < 0xd && ((0x1551U >> (uVar20 - 0x380 & 0x1f) & 1) != 0))))
    goto LAB_001a7632;
    uVar9 = uVar9 - 0x752;
    if (10 < uVar9) {
      return -1;
    }
    uVar18 = 0x607;
  }
  else {
    if (((uVar20 - 0x1829 < 0x3d) &&
        ((0x181c0e0700148855U >> ((ulong)(uVar20 - 0x1829) & 0x3f) & 1) != 0)) ||
       ((uVar20 - 0x9d0 < 0x1d && ((0x181c0e07U >> (uVar20 - 0x9d0 & 0x1f) & 1) != 0))))
    goto LAB_001a7632;
    uVar9 = uVar9 - 0xad3;
    if (0x1c < uVar9) {
      return -1;
    }
    uVar18 = 0x181c0e07;
  }
  if ((uVar18 >> (uVar9 & 0x1f) & 1) == 0) {
    return -1;
  }
LAB_001a7632:
  iVar8 = readOperands(insn);
  if ((iVar8 == 0) &&
     (uVar12 = insn->readerCursor - insn->startLocation, insn->length = uVar12, uVar12 < 0x10)) {
    if (insn->operandSize == '\0') {
      insn->operandSize = insn->registerSize;
    }
    insn->operands = x86OperandSets[insn->spec->operands];
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int decodeInstruction(struct InternalInstruction *insn,
		byteReader_t reader,
		const void *readerArg,
		uint64_t startLoc,
		DisassemblerMode mode)
{
	insn->reader = reader;
	insn->readerArg = readerArg;
	insn->startLocation = startLoc;
	insn->readerCursor = startLoc;
	insn->mode = mode;

	if (readPrefixes(insn)       ||
			readOpcode(insn)         ||
			getID(insn)      ||
			insn->instructionID == 0 ||
			invalidPrefix(insn) ||
			readOperands(insn))
		return -1;

	insn->length = (size_t)(insn->readerCursor - insn->startLocation);

	// instruction length must be <= 15 to be valid
	if (insn->length > 15)
		return -1;

	if (insn->operandSize == 0)
		insn->operandSize = insn->registerSize;

	insn->operands = &x86OperandSets[insn->spec->operands][0];

	// dbgprintf(insn, "Read from 0x%llx to 0x%llx: length %zu",
	// 		startLoc, insn->readerCursor, insn->length);

	//if (insn->length > 15)
	//	dbgprintf(insn, "Instruction exceeds 15-byte limit");

#if 0
	printf("\n>>> x86OperandSets = %lu\n", sizeof(x86OperandSets));
	printf(">>> x86DisassemblerInstrSpecifiers = %lu\n", sizeof(x86DisassemblerInstrSpecifiers));
	printf(">>> x86DisassemblerContexts = %lu\n", sizeof(x86DisassemblerContexts));
	printf(">>> modRMTable = %lu\n", sizeof(modRMTable));
	printf(">>> x86DisassemblerOneByteOpcodes = %lu\n", sizeof(x86DisassemblerOneByteOpcodes));
	printf(">>> x86DisassemblerTwoByteOpcodes = %lu\n", sizeof(x86DisassemblerTwoByteOpcodes));
	printf(">>> x86DisassemblerThreeByte38Opcodes = %lu\n", sizeof(x86DisassemblerThreeByte38Opcodes));
	printf(">>> x86DisassemblerThreeByte3AOpcodes = %lu\n", sizeof(x86DisassemblerThreeByte3AOpcodes));
	printf(">>> x86DisassemblerThreeByteA6Opcodes = %lu\n", sizeof(x86DisassemblerThreeByteA6Opcodes));
	printf(">>> x86DisassemblerThreeByteA7Opcodes= %lu\n", sizeof(x86DisassemblerThreeByteA7Opcodes));
	printf(">>> x86DisassemblerXOP8Opcodes = %lu\n", sizeof(x86DisassemblerXOP8Opcodes));
	printf(">>> x86DisassemblerXOP9Opcodes = %lu\n", sizeof(x86DisassemblerXOP9Opcodes));
	printf(">>> x86DisassemblerXOPAOpcodes = %lu\n\n", sizeof(x86DisassemblerXOPAOpcodes));
#endif

	return 0;
}